

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# projectwriter.cpp
# Opt level: O2

void __thiscall ProjectWriter::writeJunctions(ProjectWriter *this)

{
  undefined1 *puVar1;
  Node *pNVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  int iVar6;
  ostream *poVar7;
  pointer ppNVar8;
  pointer ppNVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  pointer local_48;
  pointer local_40;
  double local_38;
  
  puVar1 = &this->field_0x18;
  std::operator<<((ostream *)puVar1,"\n[JUNCTIONS]\n");
  ppNVar9 = (this->network->nodes).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  local_40 = ppNVar9;
  for (ppNVar8 = (this->network->nodes).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppNVar8 != ppNVar9; ppNVar8 = ppNVar8 + 1) {
    pNVar2 = *ppNVar8;
    iVar6 = (*(pNVar2->super_Element)._vptr_Element[2])(pNVar2);
    if (iVar6 == 0) {
      lVar3 = *(long *)&this->field_0x18;
      lVar4 = *(long *)(lVar3 + -0x18);
      *(uint *)(&this->field_0x30 + lVar4) =
           *(uint *)(&this->field_0x30 + lVar4) & 0xffffff4f | 0x20;
      *(undefined8 *)(&this->field_0x28 + *(long *)(lVar3 + -0x18)) = 0x10;
      local_48 = ppNVar8;
      poVar7 = std::operator<<((ostream *)puVar1,(string *)&(pNVar2->super_Element).name);
      std::operator<<(poVar7," ");
      lVar3 = *(long *)&this->field_0x18;
      *(undefined8 *)(&this->field_0x28 + *(long *)(lVar3 + -0x18)) = 0xc;
      *(uint *)(&this->field_0x30 + *(long *)(lVar3 + -0x18)) =
           *(uint *)(&this->field_0x30 + *(long *)(lVar3 + -0x18)) & 0xfffffefb | 4;
      *(undefined8 *)(&this->field_0x20 + *(long *)(lVar3 + -0x18)) = 4;
      std::ostream::_M_insert<double>(pNVar2->elev * (this->network->units).factors[1]);
      std::__cxx11::string::string
                ((string *)&local_68,(string *)((this->network->options).stringOptions + 5));
      bVar5 = std::operator!=(&local_68,"FIXED");
      std::__cxx11::string::~string((string *)&local_68);
      if (bVar5) {
        std::operator<<((ostream *)puVar1,"*     *    ");
        lVar3 = *(long *)&this->field_0x18;
        local_38 = (this->network->units).factors[4];
        *(undefined8 *)(&this->field_0x28 + *(long *)(lVar3 + -0x18)) = 0xc;
        *(uint *)(&this->field_0x30 + *(long *)(lVar3 + -0x18)) =
             *(uint *)(&this->field_0x30 + *(long *)(lVar3 + -0x18)) & 0xfffffefb | 4;
        *(undefined8 *)(&this->field_0x20 + *(long *)(lVar3 + -0x18)) = 4;
        std::ostream::_M_insert<double>(pNVar2[1].elev * local_38);
        lVar3 = *(long *)&this->field_0x18;
        *(undefined8 *)(&this->field_0x28 + *(long *)(lVar3 + -0x18)) = 0xc;
        *(uint *)(&this->field_0x30 + *(long *)(lVar3 + -0x18)) =
             *(uint *)(&this->field_0x30 + *(long *)(lVar3 + -0x18)) & 0xfffffefb | 4;
        *(undefined8 *)(&this->field_0x20 + *(long *)(lVar3 + -0x18)) = 4;
        std::ostream::_M_insert<double>(local_38 * pNVar2[1].xCoord);
      }
      std::operator<<((ostream *)puVar1,"\n");
      ppNVar8 = local_48;
      ppNVar9 = local_40;
    }
  }
  return;
}

Assistant:

void ProjectWriter::writeJunctions()
{
    fout << "\n[JUNCTIONS]\n";
    for (Node* node : network->nodes)
    {
        if ( node->type() == Node::JUNCTION )
        {
            Junction* junc = static_cast<Junction*>(node);
            fout << left << setw(16) << node->name << " ";
            fout << setw(12) << fixed << setprecision(4);
            fout << node->elev*network->ucf(Units::LENGTH);

            if (network->option(Options::DEMAND_MODEL) != "FIXED" )
            {
                fout << "*     *    "; //Blank fields for primary demand and pattern
                double pUcf = network->ucf(Units::PRESSURE);
                fout << setw(12) << fixed << setprecision(4);
                fout << junc->pMin * pUcf;
                fout << setw(12) << fixed << setprecision(4);
                fout << junc->pFull * pUcf;
            }
            fout <<  "\n";
        }
    }
}